

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O2

void __thiscall
QHexView::setMetadataSize
          (QHexView *this,qint64 begin,qint64 length,QColor *fgcolor,QColor *bgcolor,
          QString *comment)

{
  QHexMetadata::setMetadataSize(this->m_hexmetadata,begin,length,fgcolor,bgcolor,comment);
  return;
}

Assistant:

void QHexView::setMetadataSize(qint64 begin, qint64 length,
                               const QColor& fgcolor, const QColor& bgcolor,
                               const QString& comment) {
    m_hexmetadata->setMetadataSize(begin, length, fgcolor, bgcolor, comment);
}